

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

fy_node * fy_node_buildf(fy_document *fyd,char *fmt,...)

{
  char in_AL;
  fy_node *pfVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char *local_d8;
  undefined8 local_d0;
  void **local_c8;
  undefined1 *local_c0;
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  local_c0 = local_b8;
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  local_c8 = &ap[0].overflow_arg_area;
  local_d0 = 0x3000000010;
  local_d8 = fmt;
  local_a8 = in_RDX;
  local_a0 = in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  pfVar1 = fy_node_build_internal(fyd,parser_setup_from_fmt_ap,&local_d8);
  return pfVar1;
}

Assistant:

struct fy_node *fy_node_buildf(struct fy_document *fyd, const char *fmt, ...) {
    struct fy_node *fyn;
    va_list ap;

    va_start(ap, fmt);
    fyn = fy_node_vbuildf(fyd, fmt, ap);
    va_end(ap);

    return fyn;
}